

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_parse.c
# Opt level: O2

MPP_RET avs2d_parse_prepare_split(Avs2dCtx_t *p_dec,MppPacket *pkt,HalDecTask *task)

{
  size_t sVar1;
  void *__src;
  RK_U32 RVar2;
  ulong uVar3;
  ulong uVar4;
  RK_U8 *buf_start;
  ulong uVar5;
  RK_U8 *pRVar6;
  RK_U32 remain;
  RK_U8 *local_50;
  size_t local_48;
  HalDecTask *local_40;
  MppPacket *local_38;
  
  local_40 = task;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","In.","avs2d_parse_prepare_split");
  }
  sVar1 = mpp_packet_get_length(pkt);
  local_38 = pkt;
  __src = mpp_packet_get_pos(pkt);
  uVar5 = sVar1 & 0xffffffff;
  uVar4 = 4;
  if ((uint)sVar1 < 4) {
    uVar4 = sVar1;
  }
  uVar4 = uVar4 & 0xffffffff;
  local_50 = p_dec->prev_tail_data;
  local_48 = sVar1;
  memcpy(p_dec->prev_tail_data + 3,__src,uVar4);
  remain = 0;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","previous data[0~3]=%02x %02x %02x, first_read_length %d\n",
               "avs2d_parse_prepare_split",(ulong)p_dec->prev_tail_data[0],
               (ulong)p_dec->prev_tail_data[1],(ulong)p_dec->prev_tail_data[2],uVar4);
  }
  avs2_split_nalu(p_dec,local_50,7,3,&remain);
  uVar3 = (ulong)remain;
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","remian length %d\n","avs2d_parse_prepare_split",uVar3);
  }
  pRVar6 = (RK_U8 *)((long)__src + (uVar5 - 1));
  buf_start = (RK_U8 *)((long)__src + (uVar4 - uVar3));
  remain = 0;
  uVar4 = 0;
  do {
    RVar2 = (RK_U32)uVar4;
    if (pRVar6 <= buf_start) goto LAB_0017de80;
    avs2_split_nalu(p_dec,buf_start,((int)pRVar6 - (int)buf_start) + 1,0,&remain);
    uVar4 = (ulong)remain;
    buf_start = (RK_U8 *)((long)__src + (uVar5 - uVar4));
  } while ((p_dec->new_frame_flag == 0) &&
          ((p_dec->nal_cnt < 2 || (p_dec->p_nals[p_dec->nal_cnt - 1].eof != '\x01'))));
  local_40->valid = 1;
  RVar2 = remain;
LAB_0017de80:
  mpp_packet_set_pos(local_38,buf_start);
  if (RVar2 == 0) {
    local_50[2] = 0xff;
    local_50[0] = 0xff;
    local_50[1] = 0xff;
    if (2 < (uint)local_48) {
      p_dec->prev_tail_data[0] = *(RK_U8 *)((long)__src + (uVar5 - 1));
      p_dec->prev_tail_data[1] = *(RK_U8 *)((long)__src + (uVar5 - 2));
      p_dec->prev_tail_data[2] = *(RK_U8 *)((long)__src + (uVar5 - 3));
    }
  }
  if (((byte)avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_parse","Out.","avs2d_parse_prepare_split");
  }
  return MPP_OK;
}

Assistant:

MPP_RET avs2d_parse_prepare_split(Avs2dCtx_t *p_dec, MppPacket *pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *p_curdata = NULL;
    RK_U8 *p_start = NULL;
    RK_U8 *p_end = NULL;
    RK_U32 pkt_length = 0;
    RK_U32 first_read_length = 0;

    AVS2D_PARSE_TRACE("In.");

    pkt_length = (RK_U32) mpp_packet_get_length(pkt);

    p_curdata = p_start = (RK_U8 *) mpp_packet_get_pos(pkt);
    p_end = p_start + pkt_length - 1;

    // Combine last packet data
    first_read_length = (pkt_length >= 4) ? 4 : pkt_length;
    memcpy(p_dec->prev_tail_data + 3, p_curdata, first_read_length);

    RK_U32 remain = 0;

    AVS2D_PARSE_TRACE("previous data[0~3]=%02x %02x %02x, first_read_length %d\n",
                      p_dec->prev_tail_data[0], p_dec->prev_tail_data[1],
                      p_dec->prev_tail_data[2], first_read_length);
    ret = avs2_split_nalu(p_dec, p_dec->prev_tail_data,
                          AVS2D_PACKET_SPLIT_CHECKER_BUFFER_SIZE,
                          AVS2D_PACKET_SPLIT_LAST_KEPT_LENGTH,
                          &remain);
    p_curdata = p_start + first_read_length - remain;
    AVS2D_PARSE_TRACE("remian length %d\n", remain);

    remain = 0;

    while (p_curdata < p_end) {
        ret = avs2_split_nalu(p_dec, p_curdata, p_end - p_curdata + 1, 0, &remain);

        if (ret) {
            break;
        } else {
            p_curdata = p_end - remain + 1;
        }

        if (p_dec->new_frame_flag || (p_dec->nal_cnt > 1 && p_dec->p_nals[p_dec->nal_cnt - 1].eof == 1)) {
            task->valid = 1;
            break;
        }
    }

    mpp_packet_set_pos(pkt, p_curdata);

    if (remain == 0) {
        memset(p_dec->prev_tail_data, 0xff, 3);

        if (pkt_length >= 3) {
            p_dec->prev_tail_data[0] = p_end[0];
            p_dec->prev_tail_data[1] = p_end[-1];
            p_dec->prev_tail_data[2] = p_end[-2];
        }
    }

    AVS2D_PARSE_TRACE("Out.");
    return ret;
}